

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

void write_delta_q_params(AV1_COMMON *cm,MACROBLOCKD *xd,int skip,aom_writer *w)

{
  od_ec_enc *enc;
  aom_cdf_prob *icdf;
  uint8_t uVar1;
  ushort uVar2;
  ushort uVar3;
  MB_MODE_INFO *pMVar4;
  FRAME_CONTEXT *pFVar5;
  short sVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  FRAME_CONTEXT *in_R9;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  
  if ((cm->delta_q_info).delta_q_present_flag != 0) {
    uVar7 = cm->seq_params->mib_size - 1;
    if ((((xd->mi_row & uVar7) == 0) &&
        (pMVar4 = *xd->mi, skip == 0 || pMVar4->bsize != cm->seq_params->sb_size)) &&
       ((uVar7 & xd->mi_col) == 0)) {
      uVar11 = (long)(pMVar4->current_qindex - xd->current_base_qindex) /
               (long)(cm->delta_q_info).delta_q_res;
      pFVar5 = xd->tile_ctx;
      uVar7 = (uint)uVar11;
      uVar10 = (ulong)-uVar7;
      if (0 < (int)uVar7) {
        uVar10 = uVar11 & 0xffffffff;
      }
      uVar9 = (uint)uVar10;
      uVar11 = 3;
      if (uVar9 < 3) {
        uVar11 = uVar10;
      }
      icdf = pFVar5->delta_q_cdf;
      enc = &w->ec;
      od_ec_encode_cdf_q15(enc,(int)uVar11,icdf,4);
      if (w->allow_update_cdf != '\0') {
        uVar2 = pFVar5->delta_q_cdf[4];
        bVar8 = (char)(uVar2 >> 4) + 5;
        uVar10 = 0;
        do {
          uVar3 = icdf[uVar10];
          if (uVar10 < uVar11) {
            sVar6 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar8 & 0x1f));
          }
          else {
            sVar6 = -(uVar3 >> (bVar8 & 0x1f));
          }
          icdf[uVar10] = sVar6 + uVar3;
          uVar10 = uVar10 + 1;
        } while (uVar10 != 3);
        pFVar5->delta_q_cdf[4] = pFVar5->delta_q_cdf[4] + (ushort)(uVar2 < 0x20);
        in_R9 = pFVar5;
      }
      if (2 < uVar9) {
        uVar12 = 0x1f;
        if (uVar9 - 1 != 0) {
          for (; uVar9 - 1 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        uVar13 = 4;
        do {
          od_ec_encode_bool_q15
                    (enc,(uint)((0x1e - (uVar12 ^ 0x1f) >> (uVar13 - 2 & 0x1f) & 1) != 0),0x4000);
          uVar13 = uVar13 - 1;
        } while (1 < uVar13);
        bVar8 = (byte)uVar12 & 0x1f;
        if ((uVar12 ^ 0x1f) != 0x1f) {
          uVar12 = uVar12 + 1;
          do {
            od_ec_encode_bool_q15
                      (enc,(uint)((uVar9 + (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8) >>
                                   (uVar12 - 2 & 0x1f) & 1) != 0),0x4000);
            uVar12 = uVar12 - 1;
          } while (1 < uVar12);
        }
      }
      if (uVar7 != 0) {
        od_ec_encode_bool_q15(enc,uVar7 >> 0x1f,0x4000);
      }
      xd->current_base_qindex = pMVar4->current_qindex;
      if ((cm->delta_q_info).delta_lf_present_flag != 0) {
        if ((cm->delta_q_info).delta_lf_multi == 0) {
          write_delta_lflevel((AV1_COMMON *)xd->tile_ctx,(MACROBLOCKD *)0xffffffff,
                              ((int)pMVar4->delta_lf_from_base - (int)xd->delta_lf_from_base) /
                              (cm->delta_q_info).delta_lf_res,0,(int)w,(aom_writer *)in_R9);
          xd->delta_lf_from_base = pMVar4->delta_lf_from_base;
        }
        else {
          uVar1 = cm->seq_params->monochrome;
          uVar11 = 0;
          do {
            write_delta_lflevel((AV1_COMMON *)xd->tile_ctx,(MACROBLOCKD *)(uVar11 & 0xffffffff),
                                ((int)pMVar4->delta_lf[uVar11] - (int)xd->delta_lf[uVar11]) /
                                (cm->delta_q_info).delta_lf_res,1,(int)w,(aom_writer *)in_R9);
            xd->delta_lf[uVar11] = pMVar4->delta_lf[uVar11];
            uVar11 = uVar11 + 1;
          } while ((ulong)(uVar1 == '\0') * 2 + 2 != uVar11);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void write_delta_q_params(AV1_COMMON *const cm,
                                        MACROBLOCKD *const xd, int skip,
                                        aom_writer *w) {
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;

  if (delta_q_info->delta_q_present_flag) {
    const MB_MODE_INFO *const mbmi = xd->mi[0];
    const BLOCK_SIZE bsize = mbmi->bsize;
    const int super_block_upper_left =
        ((xd->mi_row & (cm->seq_params->mib_size - 1)) == 0) &&
        ((xd->mi_col & (cm->seq_params->mib_size - 1)) == 0);

    if ((bsize != cm->seq_params->sb_size || skip == 0) &&
        super_block_upper_left) {
      assert(mbmi->current_qindex > 0);
      const int reduced_delta_qindex =
          (mbmi->current_qindex - xd->current_base_qindex) /
          delta_q_info->delta_q_res;
      write_delta_qindex(xd, reduced_delta_qindex, w);
      xd->current_base_qindex = mbmi->current_qindex;
      if (delta_q_info->delta_lf_present_flag) {
        if (delta_q_info->delta_lf_multi) {
          const int frame_lf_count =
              av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
          for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
            int reduced_delta_lflevel =
                (mbmi->delta_lf[lf_id] - xd->delta_lf[lf_id]) /
                delta_q_info->delta_lf_res;
            write_delta_lflevel(cm, xd, lf_id, reduced_delta_lflevel, 1, w);
            xd->delta_lf[lf_id] = mbmi->delta_lf[lf_id];
          }
        } else {
          int reduced_delta_lflevel =
              (mbmi->delta_lf_from_base - xd->delta_lf_from_base) /
              delta_q_info->delta_lf_res;
          write_delta_lflevel(cm, xd, -1, reduced_delta_lflevel, 0, w);
          xd->delta_lf_from_base = mbmi->delta_lf_from_base;
        }
      }
    }
  }
}